

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>::Match
          (ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_> *this,Matcher *matcher,
          char16 *input,CharCount inputLength,CharCount *inputOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((((matcher->program).ptr)->rep).insts.litbufLen - (this->super_LiteralMixin).offset <
      (this->super_LiteralMixin).length) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x28d,"(length <= matcher.program->rep.insts.litbufLen - offset)",
                       "length <= matcher.program->rep.insts.litbufLen - offset");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = TextbookBoyerMoore<char16_t>::Match<1u,1u>
                    (&this->scanner,input,inputLength,inputOffset,
                     (((matcher->program).ptr)->rep).insts.litbuf.ptr +
                     (this->super_LiteralMixin).offset,(this->super_LiteralMixin).length,
                     matcher->stats);
  return bVar2;
}

Assistant:

inline bool
    ScannerMixinT<ScannerT>::Match(Matcher& matcher, const char16 * const input, const CharCount inputLength, CharCount& inputOffset) const
    {
        Assert(length <= matcher.program->rep.insts.litbufLen - offset);
        return scanner.template Match<1>(
            input
            , inputLength
            , inputOffset
            , matcher.program->rep.insts.litbuf + offset
            , length
#if ENABLE_REGEX_CONFIG_OPTIONS
            , matcher.stats
#endif
            );
    }